

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsprite.c
# Opt level: O3

int LoadSprite(char *file)

{
  undefined8 uVar1;
  SDL_Surface *pSVar2;
  
  uVar1 = SDL_RWFromFile(file,"rb");
  sprite = (SDL_Surface *)SDL_LoadBMP_RW(uVar1,1);
  if (sprite == (SDL_Surface *)0x0) {
    LoadSprite_cold_2();
  }
  else {
    if (sprite->format->palette != (SDL_Palette *)0x0) {
      SDL_SetColorKey(sprite,0x5000,*sprite->pixels);
    }
    pSVar2 = (SDL_Surface *)SDL_DisplayFormat(sprite);
    SDL_FreeSurface(sprite);
    if (pSVar2 != (SDL_Surface *)0x0) {
      sprite = pSVar2;
      return 0;
    }
    LoadSprite_cold_1();
  }
  return -1;
}

Assistant:

int LoadSprite(const char *file)
{
	SDL_Surface *temp;

	/* Load the sprite image */
	sprite = SDL_LoadBMP(file);
	if ( sprite == NULL ) {
		fprintf(stderr, "Couldn't load %s: %s", file, SDL_GetError());
		return(-1);
	}

	/* Set transparent pixel as the pixel at (0,0) */
	if ( sprite->format->palette ) {
		SDL_SetColorKey(sprite, (SDL_SRCCOLORKEY|SDL_RLEACCEL),
						*(Uint8 *)sprite->pixels);
	}

	/* Convert sprite to video format */
	temp = SDL_DisplayFormat(sprite);
	SDL_FreeSurface(sprite);
	if ( temp == NULL ) {
		fprintf(stderr, "Couldn't convert background: %s\n",
							SDL_GetError());
		return(-1);
	}
	sprite = temp;

	/* We're ready to roll. :) */
	return(0);
}